

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool __thiscall
duckdb_snappy::SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator>::SlowAppendFromSelf
          (SnappyScatteredWriter<duckdb_snappy::SnappySinkAllocator> *this,size_t offset,size_t len)

{
  char cVar1;
  bool bVar2;
  undefined8 in_RAX;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char c;
  undefined8 uStack_28;
  
  pcVar3 = this->op_ptr_;
  pcVar4 = pcVar3 + (this->full_size_ - (long)this->op_base_);
  if (((char *)(offset - 1) < pcVar4) && (len <= this->expected_ - (long)pcVar4)) {
    if (len != 0) {
      uVar5 = (long)pcVar4 - offset;
      uStack_28 = in_RAX;
      do {
        cVar1 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5 >> 0x10][uVar5 & 0xffff];
        uStack_28 = CONCAT17(cVar1,(undefined7)uStack_28);
        if (this->op_limit_ == pcVar3) {
          this->op_ptr_ = pcVar3;
          bVar2 = SlowAppend(this,(char *)((long)&uStack_28 + 7),1);
          if (!bVar2) goto LAB_01bd20a2;
          pcVar3 = this->op_ptr_;
        }
        else {
          *pcVar3 = cVar1;
          pcVar3 = pcVar3 + 1;
        }
        len = len - 1;
        uVar5 = uVar5 + 1;
      } while (len != 0);
    }
    this->op_ptr_ = pcVar3;
    bVar2 = true;
  }
  else {
LAB_01bd20a2:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline size_t Size() const { return full_size_ + (op_ptr_ - op_base_); }